

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACL.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Policies::ACL::list_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ACL *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  Path local_58;
  Url local_38;
  
  client = *(Client **)this;
  paVar1 = &local_58.value_.field_2;
  local_58.value_.field_2._8_8_ = 0;
  local_58.value_._M_string_length = 0;
  local_58.value_.field_2._M_allocated_capacity = 0;
  local_58.value_._M_dataplus._M_p = (pointer)paVar1;
  getUrl(&local_38,this,&local_58);
  Policies::list(__return_storage_ptr__,client,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value_._M_dataplus._M_p != &local_38.value_.field_2) {
    operator_delete(local_38.value_._M_dataplus._M_p,
                    local_38.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.value_._M_dataplus._M_p,
                    local_58.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Policies::ACL::list() {
  return Vault::Sys::Policies::list(client_, getUrl(Path{}));
}